

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O2

ostream * __thiscall absl::operator<<(absl *this,ostream *os,uint128 v)

{
  uint *puVar1;
  uint uVar2;
  uint128 dividend;
  ostream *poVar3;
  ostringstream *poVar4;
  uint64_t uVar5;
  char cVar6;
  ulong uVar7;
  long lVar8;
  undefined8 uVar9;
  uint128 divisor;
  uint128 divisor_00;
  uint128 dividend_00;
  string rep;
  uint128 local_1d8;
  uint128 local_1c8;
  uint128 low;
  ostringstream os_1;
  uint auStack_190 [88];
  
  uVar5 = v.lo_;
  uVar2 = *(uint *)(this + *(long *)(*(long *)this + -0x18) + 0x18);
  if ((uVar2 & 0x4a) == 8) {
    uVar9 = 0xf;
    uVar7 = 0x1000000000000000;
  }
  else if ((uVar2 & 0x4a) == 0x40) {
    uVar9 = 0x15;
    uVar7 = 0x8000000000000000;
  }
  else {
    uVar9 = 0x13;
    uVar7 = 10000000000000000000;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os_1);
  *(uint *)((long)auStack_190 + *(long *)(_os_1 + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(_os_1 + -0x18)) & 0xffffbdb5 | uVar2 & 0x424a;
  divisor.hi_ = 0;
  divisor.lo_ = uVar7;
  dividend_00.hi_ = uVar5;
  dividend_00.lo_ = (uint64_t)os;
  local_1c8.lo_ = (uint64_t)os;
  local_1c8.hi_ = uVar5;
  anon_unknown_2::DivModImpl(dividend_00,divisor,&local_1c8,&low);
  dividend.hi_ = local_1c8.hi_;
  dividend.lo_ = local_1c8.lo_;
  divisor_00.hi_ = 0;
  divisor_00.lo_ = uVar7;
  anon_unknown_2::DivModImpl(dividend,divisor_00,&local_1c8,&local_1d8);
  if ((ostream *)local_1c8.lo_ == (ostream *)0x0) {
    if (local_1d8.lo_ != 0) {
      std::ostream::_M_insert<unsigned_long>((ulong)&os_1);
      puVar1 = (uint *)((long)auStack_190 + *(long *)(_os_1 + -0x18));
      *puVar1 = *puVar1 & 0xfffffdff;
      poVar4 = (ostringstream *)std::operator<<(&os_1,0x30);
      goto LAB_00265f28;
    }
  }
  else {
    std::ostream::_M_insert<unsigned_long>((ulong)&os_1);
    poVar4 = &os_1;
    puVar1 = (uint *)((long)auStack_190 + *(long *)(_os_1 + -0x18));
    *puVar1 = *puVar1 & 0xfffffdff;
    poVar3 = std::operator<<(poVar4,0x30);
    *(undefined8 *)(&poVar3->field_0x10 + (long)poVar3->_vptr_basic_ostream[-3]) = uVar9;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
LAB_00265f28:
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = uVar9;
  }
  std::ostream::_M_insert<unsigned_long>((ulong)&os_1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os_1);
  uVar7 = *(ulong *)(this + *(long *)(*(long *)this + -0x18) + 0x10);
  *(undefined8 *)(this + *(long *)(*(long *)this + -0x18) + 0x10) = 0;
  lVar8 = uVar7 - rep._M_string_length;
  if (uVar7 < rep._M_string_length || lVar8 == 0) goto LAB_00265fed;
  cVar6 = (char)lVar8;
  if (((byte)uVar2 & 0xb0) == 0x10) {
    if ((uVar2 & 0x24a) != 0x208) goto LAB_00265fcf;
    if (os == (ostream *)0x0 && uVar5 == 0) goto LAB_00265fcf;
    std::ios::fill();
    uVar7 = 2;
  }
  else {
    if ((uVar2 & 0xb0) == 0x20) {
      std::ios::fill();
      std::__cxx11::string::append((ulong)&rep,cVar6);
      goto LAB_00265fed;
    }
LAB_00265fcf:
    std::ios::fill();
    uVar7 = 0;
  }
  std::__cxx11::string::insert((ulong)&rep,uVar7,cVar6);
LAB_00265fed:
  poVar3 = std::operator<<((ostream *)this,(string *)&rep);
  std::__cxx11::string::~string((string *)&rep);
  return poVar3;
}

Assistant:

std::ostream& operator<<(std::ostream& os, uint128 v) {
  std::ios_base::fmtflags flags = os.flags();
  std::string rep = Uint128ToFormattedString(v, flags);

  // Add the requisite padding.
  std::streamsize width = os.width(0);
  if (static_cast<size_t>(width) > rep.size()) {
    std::ios::fmtflags adjustfield = flags & std::ios::adjustfield;
    if (adjustfield == std::ios::left) {
      rep.append(width - rep.size(), os.fill());
    } else if (adjustfield == std::ios::internal &&
               (flags & std::ios::showbase) &&
               (flags & std::ios::basefield) == std::ios::hex && v != 0) {
      rep.insert(2, width - rep.size(), os.fill());
    } else {
      rep.insert(0, width - rep.size(), os.fill());
    }
  }

  return os << rep;
}